

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O2

uint zt_log_set_opts(zt_log_ty *log,uint opts)

{
  uint uVar1;
  
  if ((log == (zt_log_ty *)0x0) && (log = zt_log_get_logger(), log == (zt_log_ty *)0x0)) {
    return 0;
  }
  uVar1 = log->opts;
  log->opts = opts;
  return uVar1;
}

Assistant:

unsigned int
zt_log_set_opts(zt_log_ty * log, unsigned int opts) {
    unsigned int oopts;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        return 0;
    }

    oopts     = log->opts;
    log->opts = opts;
    return oopts;
}